

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_PtrDumpVerilog(char *pFileName,Vec_Ptr_t *vDes)

{
  FILE *__stream;
  void *pvVar1;
  char *pcVar2;
  Vec_Ptr_t *vNtk;
  int i;
  
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    pvVar1 = Vec_PtrEntry(vDes,0);
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"// Design \"%s\" written via Ptr in ABC on %s\n\n",pvVar1,pcVar2);
    for (i = 1; i < vDes->nSize; i = i + 1) {
      vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes,i);
      Bac_PtrDumpModuleVerilog((FILE *)__stream,vNtk);
    }
    fclose(__stream);
    return;
  }
  printf("Cannot open output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Bac_PtrDumpVerilog( char * pFileName, Vec_Ptr_t * vDes )
{
    FILE * pFile;
    Vec_Ptr_t * vNtk; int i;
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Design \"%s\" written via Ptr in ABC on %s\n\n", (char *)Vec_PtrEntry(vDes, 0), Extra_TimeStamp() );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Bac_PtrDumpModuleVerilog( pFile, vNtk );
    fclose( pFile );
}